

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_delimited.pb.cc
# Opt level: O3

bool editions_unittest::TestDelimited::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  
  bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized
                    ((ExtensionSet *)(msg + 1),(MessageLite *)_TestDelimited_default_instance_);
  if (bVar1) {
    if ((msg[2]._internal_metadata_.ptr_ & 2) != 0) {
      bVar1 = IsInitializedImpl((MessageLite *)msg[3]._internal_metadata_.ptr_);
      if (!bVar1) goto LAB_00cd08b1;
    }
    bVar1 = true;
  }
  else {
LAB_00cd08b1:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

PROTOBUF_NOINLINE bool TestDelimited::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const TestDelimited&>(msg);
  if (!this_._impl_._extensions_.IsInitialized(&default_instance())) {
    return false;
  }
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._impl_.nested_->IsInitialized()) return false;
  }
  return true;
}